

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O1

lgx_symbol_t *
symbol_add(lgx_ast_t *ast,lgx_ast_node_t *node,lgx_ht_t *symbols,lgx_symbol_type_t s_type,
          lgx_str_t *name,uchar is_global)

{
  long lVar1;
  int iVar2;
  lgx_ht_node_t *plVar3;
  lgx_symbol_t *v;
  
  plVar3 = lgx_ht_get(symbols,name);
  if (plVar3 == (lgx_ht_node_t *)0x0) {
    v = (lgx_symbol_t *)calloc(1,0x48);
    if (v == (lgx_symbol_t *)0x0) {
      v = (lgx_symbol_t *)0x0;
    }
    else {
      v->s_type = s_type;
      v->node = node;
      v->field_0x3c = v->field_0x3c & 0xfe | is_global & 1;
      iVar2 = lgx_ht_set(symbols,name,v);
      if (iVar2 != 0) {
        lgx_value_cleanup(&v->v);
        lgx_type_cleanup(&v->type);
        free(v);
        v = (lgx_symbol_t *)0x0;
        symbol_error(ast,node,"symbol `%.*s` unkonwn error\n",(ulong)name->length,name->buffer);
      }
    }
  }
  else {
    lVar1 = *(long *)((long)plVar3->v + 0x40);
    v = (lgx_symbol_t *)0x0;
    symbol_error(ast,node,"symbol `%.*s` alreay declared at line %d row %d\n",(ulong)name->length,
                 name->buffer,(ulong)*(uint *)(lVar1 + 0x28),*(undefined4 *)(lVar1 + 0x2c));
  }
  return v;
}

Assistant:

static lgx_symbol_t* symbol_add(lgx_ast_t* ast, lgx_ast_node_t* node,
    lgx_ht_t* symbols, lgx_symbol_type_t s_type,
    lgx_str_t* name, unsigned char is_global) {

    lgx_ht_node_t* ht_node = lgx_ht_get(symbols, name);
    if (ht_node) {
        lgx_symbol_t* symbol = (lgx_symbol_t*)ht_node->v;
        symbol_error(ast, node, "symbol `%.*s` alreay declared at line %d row %d\n", name->length, name->buffer, symbol->node->line, symbol->node->row);
        return NULL;
    }

    lgx_symbol_t* symbol = symbol_new();
    if (!symbol) {
        return NULL;
    }
    symbol->s_type = s_type;
    symbol->node = node;
    symbol->is_global = is_global;

    if (lgx_ht_set(symbols, name, symbol)) {
        symbol_del(symbol);
        symbol_error(ast, node, "symbol `%.*s` unkonwn error\n", name->length, name->buffer);
        return NULL;
    }

    return symbol;
}